

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

Ref<embree::XML> embree::parseHeader(Ref<embree::Stream<embree::Token>_> *cin)

{
  bool bVar1;
  _func_int **pp_Var2;
  runtime_error *this;
  Token *this_00;
  undefined8 *in_RSI;
  XML *in_RDI;
  Ref<embree::XML> *xml;
  Token *in_stack_fffffffffffffcb8;
  Token *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd8;
  XML *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffd18;
  string *str;
  Token *in_stack_fffffffffffffd28;
  XML *this_01;
  Stream<embree::Token> *this_02;
  Stream<embree::Token> *in_stack_fffffffffffffd80;
  string local_278 [176];
  string local_1c8 [39];
  undefined1 local_1a1;
  string local_180 [39];
  allocator local_159;
  string local_158 [48];
  Ref<embree::Stream<embree::Token>_> *in_stack_fffffffffffffed8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffee8;
  Ref<embree::Stream<embree::Token>_> *in_stack_fffffffffffffef0;
  undefined1 local_91 [40];
  undefined1 local_69;
  undefined8 *local_68;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 *local_38;
  _func_int **local_30;
  
  local_69 = 0;
  this_01 = in_RDI;
  local_68 = in_RSI;
  pp_Var2 = (_func_int **)::operator_new(0xb0);
  this_02 = (Stream<embree::Token> *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_91 + 1),"",(allocator *)this_02);
  XML::XML(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var2;
  local_30 = pp_Var2;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  local_38 = local_68;
  Stream<embree::Token>::get(in_stack_fffffffffffffd80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"<?",&local_159);
  Token::Sym(in_stack_fffffffffffffd18);
  bVar1 = operator!=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  Token::~Token(in_stack_fffffffffffffcc0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  Token::~Token(in_stack_fffffffffffffcc0);
  if (bVar1) {
    local_1a1 = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40 = local_68;
    this_00 = Stream<embree::Token>::unget
                        ((Stream<embree::Token> *)in_stack_fffffffffffffce0,
                         (size_t)in_stack_fffffffffffffcd8);
    Token::Location(this_00);
    ParseLocation::str_abi_cxx11_((ParseLocation *)this_01);
    std::operator+(in_stack_fffffffffffffcc8,(char *)in_stack_fffffffffffffcc0);
    std::runtime_error::runtime_error(this,local_180);
    local_1a1 = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_48 = local_68;
  str = (string *)*local_68;
  Stream<embree::Token>::get(in_stack_fffffffffffffd80);
  Token::Identifier_abi_cxx11_(in_stack_fffffffffffffd28);
  std::__cxx11::string::operator=((string *)((in_RDI->super_RefCount)._vptr_RefCount + 6),local_1c8)
  ;
  std::__cxx11::string::~string(local_1c8);
  Token::~Token(in_stack_fffffffffffffcc0);
  parseComments(in_stack_fffffffffffffed8);
  while( true ) {
    local_50 = local_68;
    Stream<embree::Token>::peek(this_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"?>",(allocator *)&stack0xfffffffffffffd87);
    Token::Sym(str);
    bVar1 = operator!=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    Token::~Token(in_stack_fffffffffffffcc0);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd87);
    if (!bVar1) break;
    parseParm(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    parseComments(in_stack_fffffffffffffed8);
  }
  local_58 = local_68;
  Stream<embree::Token>::drop(this_02);
  return (Ref<embree::XML>)this_01;
}

Assistant:

Ref<XML> parseHeader(Ref<Stream<Token> >& cin)
  {
    Ref<XML> xml = new XML;
    if (cin->get() != Token::Sym("<?")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": wrong XML header");
    xml->name = cin->get().Identifier();
    parseComments(cin);
    while (cin->peek() != Token::Sym("?>")) {
      parseParm(cin,xml->parms);
      parseComments(cin);
    }
    cin->drop();
    return xml;
  }